

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O0

void __thiscall
Assimp::SMDImporter::ParseSkeletonSection(SMDImporter *this,char *szCurrent,char **szCurrentOut)

{
  bool bVar1;
  int *piVar2;
  int local_24;
  char **ppcStack_20;
  int iTime;
  char **szCurrentOut_local;
  char *szCurrent_local;
  SMDImporter *this_local;
  
  local_24 = 0;
  ppcStack_20 = szCurrentOut;
  szCurrentOut_local = (char **)szCurrent;
  szCurrent_local = (char *)this;
  while ((bVar1 = SkipSpacesAndLineEnd(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local)
         , bVar1 && (bVar1 = TokenMatch<char_const>((char **)&szCurrentOut_local,"end",3), !bVar1)))
  {
    bVar1 = TokenMatch<char_const>((char **)&szCurrentOut_local,"time",4);
    if (bVar1) {
      bVar1 = ParseSignedInt(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local,&local_24)
      ;
      if (!bVar1) break;
      piVar2 = std::min<int>(&this->iSmallestFrame,&local_24);
      this->iSmallestFrame = *piVar2;
      SkipLine(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local);
    }
    else {
      ParseSkeletonElement(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local,local_24);
    }
  }
  *ppcStack_20 = (char *)szCurrentOut_local;
  return;
}

Assistant:

void SMDImporter::ParseSkeletonSection(const char* szCurrent, const char** szCurrentOut) {
    int iTime = 0;
    for ( ;; ) {
        if (!SkipSpacesAndLineEnd(szCurrent,&szCurrent)) {
            break;
        }

        // "end\n" - Ends the skeleton section
        if (TokenMatch(szCurrent,"end",3)) {
            break;
        } else if (TokenMatch(szCurrent,"time",4)) {
        // "time <n>\n" - Specifies the current animation frame
            if(!ParseSignedInt(szCurrent,&szCurrent,iTime)) {
                break;
            }

            iSmallestFrame = std::min(iSmallestFrame,iTime);
            SkipLine(szCurrent,&szCurrent);
        } else {
            ParseSkeletonElement(szCurrent,&szCurrent,iTime);
        }
    }
    *szCurrentOut = szCurrent;
}